

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O1

void __thiscall
tcu::ThreadUtil::CompareData::CompareData
          (CompareData *this,SharedPtr<tcu::ThreadUtil::DataBlock> *a,
          SharedPtr<tcu::ThreadUtil::DataBlock> *b)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  SharedPtr<tcu::ThreadUtil::Object> local_48;
  SharedPtr<tcu::ThreadUtil::Object> local_38;
  
  Operation::Operation(&this->super_Operation,"CompareData");
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__CompareData_003f6d70;
  (this->m_a).m_ptr = a->m_ptr;
  pSVar2 = a->m_state;
  (this->m_a).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_a).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  (this->m_b).m_ptr = b->m_ptr;
  pSVar2 = b->m_state;
  (this->m_b).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_b).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  local_38.m_ptr = &a->m_ptr->super_Object;
  local_38.m_state = a->m_state;
  if (local_38.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_38.m_state)->strongRefCount = (local_38.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_38.m_state)->weakRefCount = (local_38.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::readObject(&this->super_Operation,&local_38);
  if (local_38.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_38.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_38.m_ptr = (Object *)0x0;
      (*(local_38.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_38.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_38.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_38.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_38.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  local_48.m_ptr = &b->m_ptr->super_Object;
  local_48.m_state = b->m_state;
  if (local_48.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_48.m_state)->strongRefCount = (local_48.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_48.m_state)->weakRefCount = (local_48.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::readObject(&this->super_Operation,&local_48);
  if (local_48.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_48.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_48.m_ptr = (Object *)0x0;
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_48.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_48.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

CompareData::CompareData (SharedPtr<DataBlock> a, SharedPtr<DataBlock> b)
	: Operation	("CompareData")
	, m_a		(a)
	, m_b		(b)
{
	readObject(SharedPtr<Object>(a));
	readObject(SharedPtr<Object>(b));
}